

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O1

void cftf162(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  
  dVar33 = w[1];
  dVar1 = w[4];
  dVar34 = *a - a[0x11];
  dVar29 = a[1] + a[0x10];
  dVar9 = a[8] - a[0x19];
  dVar17 = a[9] + a[0x18];
  dVar18 = (dVar9 - dVar17) * dVar33;
  dVar9 = (dVar17 + dVar9) * dVar33;
  dVar10 = dVar34 + dVar18;
  dVar11 = dVar29 + dVar9;
  dVar34 = dVar34 - dVar18;
  dVar29 = dVar29 - dVar9;
  dVar9 = *a + a[0x11];
  dVar23 = a[1] - a[0x10];
  dVar17 = a[8] + a[0x19];
  dVar24 = a[9] - a[0x18];
  dVar18 = (dVar17 - dVar24) * dVar33;
  dVar25 = (dVar24 + dVar17) * dVar33;
  dVar2 = dVar9 - dVar25;
  dVar3 = dVar23 + dVar18;
  dVar25 = dVar25 + dVar9;
  dVar23 = dVar23 - dVar18;
  dVar18 = a[2] - a[0x13];
  dVar17 = a[3] + a[0x12];
  dVar9 = w[5];
  dVar13 = dVar1 * dVar18 - dVar17 * dVar9;
  dVar7 = dVar18 * dVar9 + dVar1 * dVar17;
  dVar17 = w[7];
  dVar24 = a[10] - a[0x1b];
  dVar19 = a[0xb] + a[0x1a];
  dVar18 = w[6];
  dVar28 = -dVar17 * dVar24 - dVar19 * dVar18;
  dVar24 = dVar24 * dVar18 - dVar17 * dVar19;
  dVar20 = dVar13 + dVar28;
  dVar13 = dVar13 - dVar28;
  dVar21 = dVar7 + dVar24;
  dVar7 = dVar7 - dVar24;
  dVar19 = a[2] + a[0x13];
  dVar24 = a[3] - a[0x12];
  dVar28 = dVar18 * dVar19 + dVar17 * dVar24;
  dVar24 = dVar24 * dVar18 - dVar19 * dVar17;
  dVar19 = a[10] + a[0x1b];
  dVar30 = a[0xb] - a[0x1a];
  dVar5 = dVar1 * dVar19 + dVar9 * dVar30;
  dVar31 = dVar30 * dVar1 - dVar19 * dVar9;
  dVar30 = dVar28 - dVar5;
  dVar5 = dVar5 + dVar28;
  dVar4 = dVar24 - dVar31;
  dVar31 = dVar31 + dVar24;
  dVar28 = a[4] - a[0x15];
  dVar8 = a[5] + a[0x14];
  dVar24 = w[8];
  dVar19 = w[9];
  dVar14 = dVar24 * dVar28 - dVar8 * dVar19;
  dVar6 = dVar28 * dVar19 + dVar24 * dVar8;
  dVar28 = a[0xd] + a[0x1c];
  dVar8 = a[0xc] - a[0x1d];
  dVar36 = dVar19 * dVar8 - dVar28 * dVar24;
  dVar28 = dVar8 * dVar24 + dVar19 * dVar28;
  dVar26 = dVar14 + dVar36;
  dVar14 = dVar14 - dVar36;
  dVar15 = dVar6 + dVar28;
  dVar6 = dVar6 - dVar28;
  dVar8 = a[4] + a[0x15];
  dVar28 = a[5] - a[0x14];
  dVar16 = dVar19 * dVar8 - dVar28 * dVar24;
  dVar28 = dVar8 * dVar24 + dVar19 * dVar28;
  dVar36 = a[0xc] + a[0x1d];
  dVar8 = a[0xd] - a[0x1c];
  dVar37 = dVar24 * dVar36 - dVar8 * dVar19;
  dVar36 = dVar8 * dVar24 + dVar36 * dVar19;
  dVar24 = dVar16 - dVar37;
  dVar37 = dVar37 + dVar16;
  dVar19 = dVar28 - dVar36;
  dVar36 = dVar36 + dVar28;
  dVar28 = a[6] - a[0x17];
  dVar8 = a[7] + a[0x16];
  dVar12 = dVar18 * dVar28 + dVar17 * dVar8;
  dVar27 = dVar8 * dVar18 - dVar28 * dVar17;
  dVar16 = a[0xf] + a[0x1e];
  dVar28 = a[0xe] - a[0x1f];
  dVar8 = dVar9 * dVar28 - dVar16 * dVar1;
  dVar28 = dVar28 * dVar1 + dVar9 * dVar16;
  dVar22 = dVar12 + dVar8;
  dVar12 = dVar12 - dVar8;
  dVar8 = dVar27 + dVar28;
  dVar27 = dVar27 - dVar28;
  dVar28 = a[6] + a[0x17];
  dVar16 = a[7] - a[0x16];
  dVar32 = dVar9 * dVar28 + dVar1 * dVar16;
  dVar9 = dVar16 * dVar9 - dVar28 * dVar1;
  dVar28 = a[0xe] + a[0x1f];
  dVar16 = a[0xf] - a[0x1e];
  dVar1 = -dVar17 * dVar28 - dVar16 * dVar18;
  dVar18 = dVar28 * dVar18 - dVar17 * dVar16;
  dVar17 = dVar32 + dVar1;
  dVar32 = dVar32 - dVar1;
  dVar35 = dVar9 + dVar18;
  dVar9 = dVar9 - dVar18;
  dVar1 = dVar10 + dVar26;
  dVar18 = dVar20 + dVar22;
  *a = dVar1 + dVar18;
  dVar28 = dVar11 + dVar15;
  dVar16 = dVar21 + dVar8;
  a[1] = dVar28 + dVar16;
  a[2] = dVar1 - dVar18;
  a[3] = dVar28 - dVar16;
  dVar10 = dVar10 - dVar26;
  dVar11 = dVar11 - dVar15;
  dVar20 = dVar20 - dVar22;
  dVar21 = dVar21 - dVar8;
  a[4] = dVar10 - dVar21;
  a[5] = dVar11 + dVar20;
  a[6] = dVar21 + dVar10;
  a[7] = dVar11 - dVar20;
  dVar1 = dVar13 - dVar27;
  dVar28 = dVar7 + dVar12;
  dVar18 = dVar34 - dVar6;
  dVar8 = (dVar1 - dVar28) * dVar33;
  a[8] = dVar18 + dVar8;
  dVar10 = dVar29 + dVar14;
  dVar1 = (dVar28 + dVar1) * dVar33;
  a[9] = dVar10 + dVar1;
  a[10] = dVar18 - dVar8;
  a[0xb] = dVar10 - dVar1;
  dVar6 = dVar6 + dVar34;
  dVar29 = dVar29 - dVar14;
  dVar27 = dVar27 + dVar13;
  dVar7 = dVar7 - dVar12;
  dVar1 = (dVar7 + dVar27) * dVar33;
  a[0xc] = dVar6 - dVar1;
  dVar18 = (dVar27 - dVar7) * dVar33;
  a[0xd] = dVar29 + dVar18;
  a[0xe] = dVar1 + dVar6;
  a[0xf] = dVar29 - dVar18;
  dVar1 = dVar2 + dVar24;
  dVar18 = dVar30 - dVar17;
  a[0x10] = dVar1 + dVar18;
  dVar28 = dVar3 + dVar19;
  dVar7 = dVar4 - dVar35;
  a[0x11] = dVar28 + dVar7;
  a[0x12] = dVar1 - dVar18;
  a[0x13] = dVar28 - dVar7;
  dVar2 = dVar2 - dVar24;
  dVar3 = dVar3 - dVar19;
  dVar17 = dVar17 + dVar30;
  dVar35 = dVar35 + dVar4;
  a[0x14] = dVar2 - dVar35;
  a[0x15] = dVar3 + dVar17;
  a[0x16] = dVar35 + dVar2;
  a[0x17] = dVar3 - dVar17;
  dVar1 = dVar25 - dVar36;
  dVar17 = dVar23 + dVar37;
  dVar18 = dVar5 + dVar9;
  dVar24 = dVar31 - dVar32;
  dVar19 = (dVar18 - dVar24) * dVar33;
  dVar18 = (dVar24 + dVar18) * dVar33;
  a[0x18] = dVar1 + dVar19;
  a[0x19] = dVar17 + dVar18;
  a[0x1a] = dVar1 - dVar19;
  a[0x1b] = dVar17 - dVar18;
  dVar36 = dVar36 + dVar25;
  dVar23 = dVar23 - dVar37;
  dVar5 = dVar5 - dVar9;
  dVar32 = dVar32 + dVar31;
  dVar1 = (dVar5 - dVar32) * dVar33;
  dVar33 = (dVar32 + dVar5) * dVar33;
  a[0x1c] = dVar36 - dVar33;
  a[0x1d] = dVar23 + dVar1;
  a[0x1e] = dVar33 + dVar36;
  a[0x1f] = dVar23 - dVar1;
  return;
}

Assistant:

void cftf162(FFTFLT *a, FFTFLT *w)
{
    FFTFLT wn4r, wk1r, wk1i, wk2r, wk2i, wk3r, wk3i,
        x0r, x0i, x1r, x1i, x2r, x2i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
        y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i,
        y8r, y8i, y9r, y9i, y10r, y10i, y11r, y11i,
        y12r, y12i, y13r, y13i, y14r, y14i, y15r, y15i;

    wn4r = w[1];
    wk1r = w[4];
    wk1i = w[5];
    wk3r = w[6];
    wk3i = -w[7];
    wk2r = w[8];
    wk2i = w[9];
    x1r = a[0] - a[17];
    x1i = a[1] + a[16];
    x0r = a[8] - a[25];
    x0i = a[9] + a[24];
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    y0r = x1r + x2r;
    y0i = x1i + x2i;
    y4r = x1r - x2r;
    y4i = x1i - x2i;
    x1r = a[0] + a[17];
    x1i = a[1] - a[16];
    x0r = a[8] + a[25];
    x0i = a[9] - a[24];
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    y8r = x1r - x2i;
    y8i = x1i + x2r;
    y12r = x1r + x2i;
    y12i = x1i - x2r;
    x0r = a[2] - a[19];
    x0i = a[3] + a[18];
    x1r = wk1r * x0r - wk1i * x0i;
    x1i = wk1r * x0i + wk1i * x0r;
    x0r = a[10] - a[27];
    x0i = a[11] + a[26];
    x2r = wk3i * x0r - wk3r * x0i;
    x2i = wk3i * x0i + wk3r * x0r;
    y1r = x1r + x2r;
    y1i = x1i + x2i;
    y5r = x1r - x2r;
    y5i = x1i - x2i;
    x0r = a[2] + a[19];
    x0i = a[3] - a[18];
    x1r = wk3r * x0r - wk3i * x0i;
    x1i = wk3r * x0i + wk3i * x0r;
    x0r = a[10] + a[27];
    x0i = a[11] - a[26];
    x2r = wk1r * x0r + wk1i * x0i;
    x2i = wk1r * x0i - wk1i * x0r;
    y9r = x1r - x2r;
    y9i = x1i - x2i;
    y13r = x1r + x2r;
    y13i = x1i + x2i;
    x0r = a[4] - a[21];
    x0i = a[5] + a[20];
    x1r = wk2r * x0r - wk2i * x0i;
    x1i = wk2r * x0i + wk2i * x0r;
    x0r = a[12] - a[29];
    x0i = a[13] + a[28];
    x2r = wk2i * x0r - wk2r * x0i;
    x2i = wk2i * x0i + wk2r * x0r;
    y2r = x1r + x2r;
    y2i = x1i + x2i;
    y6r = x1r - x2r;
    y6i = x1i - x2i;
    x0r = a[4] + a[21];
    x0i = a[5] - a[20];
    x1r = wk2i * x0r - wk2r * x0i;
    x1i = wk2i * x0i + wk2r * x0r;
    x0r = a[12] + a[29];
    x0i = a[13] - a[28];
    x2r = wk2r * x0r - wk2i * x0i;
    x2i = wk2r * x0i + wk2i * x0r;
    y10r = x1r - x2r;
    y10i = x1i - x2i;
    y14r = x1r + x2r;
    y14i = x1i + x2i;
    x0r = a[6] - a[23];
    x0i = a[7] + a[22];
    x1r = wk3r * x0r - wk3i * x0i;
    x1i = wk3r * x0i + wk3i * x0r;
    x0r = a[14] - a[31];
    x0i = a[15] + a[30];
    x2r = wk1i * x0r - wk1r * x0i;
    x2i = wk1i * x0i + wk1r * x0r;
    y3r = x1r + x2r;
    y3i = x1i + x2i;
    y7r = x1r - x2r;
    y7i = x1i - x2i;
    x0r = a[6] + a[23];
    x0i = a[7] - a[22];
    x1r = wk1i * x0r + wk1r * x0i;
    x1i = wk1i * x0i - wk1r * x0r;
    x0r = a[14] + a[31];
    x0i = a[15] - a[30];
    x2r = wk3i * x0r - wk3r * x0i;
    x2i = wk3i * x0i + wk3r * x0r;
    y11r = x1r + x2r;
    y11i = x1i + x2i;
    y15r = x1r - x2r;
    y15i = x1i - x2i;
    x1r = y0r + y2r;
    x1i = y0i + y2i;
    x2r = y1r + y3r;
    x2i = y1i + y3i;
    a[0] = x1r + x2r;
    a[1] = x1i + x2i;
    a[2] = x1r - x2r;
    a[3] = x1i - x2i;
    x1r = y0r - y2r;
    x1i = y0i - y2i;
    x2r = y1r - y3r;
    x2i = y1i - y3i;
    a[4] = x1r - x2i;
    a[5] = x1i + x2r;
    a[6] = x1r + x2i;
    a[7] = x1i - x2r;
    x1r = y4r - y6i;
    x1i = y4i + y6r;
    x0r = y5r - y7i;
    x0i = y5i + y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[8] = x1r + x2r;
    a[9] = x1i + x2i;
    a[10] = x1r - x2r;
    a[11] = x1i - x2i;
    x1r = y4r + y6i;
    x1i = y4i - y6r;
    x0r = y5r + y7i;
    x0i = y5i - y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[12] = x1r - x2i;
    a[13] = x1i + x2r;
    a[14] = x1r + x2i;
    a[15] = x1i - x2r;
    x1r = y8r + y10r;
    x1i = y8i + y10i;
    x2r = y9r - y11r;
    x2i = y9i - y11i;
    a[16] = x1r + x2r;
    a[17] = x1i + x2i;
    a[18] = x1r - x2r;
    a[19] = x1i - x2i;
    x1r = y8r - y10r;
    x1i = y8i - y10i;
    x2r = y9r + y11r;
    x2i = y9i + y11i;
    a[20] = x1r - x2i;
    a[21] = x1i + x2r;
    a[22] = x1r + x2i;
    a[23] = x1i - x2r;
    x1r = y12r - y14i;
    x1i = y12i + y14r;
    x0r = y13r + y15i;
    x0i = y13i - y15r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[24] = x1r + x2r;
    a[25] = x1i + x2i;
    a[26] = x1r - x2r;
    a[27] = x1i - x2i;
    x1r = y12r + y14i;
    x1i = y12i - y14r;
    x0r = y13r - y15i;
    x0i = y13i + y15r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[28] = x1r - x2i;
    a[29] = x1i + x2r;
    a[30] = x1r + x2i;
    a[31] = x1i - x2r;
}